

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O2

void __thiscall Conn::handle(Conn *this,epoll_event *cur_ev)

{
  FILE *__stream;
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ConnInfo *pCVar5;
  Conn *pCVar6;
  socklen_t client_sock_len;
  sockaddr_in client_sock_addr;
  
  uVar1 = cur_ev->events;
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 4) == 0) {
      if ((uVar1 & 0x10) != 0) {
        fprintf(_stderr,"%s(%d)-<%s>: epollhup fd %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
                ,0x74,"handle",(ulong)(cur_ev->data).u32);
        goto LAB_00102a62;
      }
    }
    else {
      uVar1 = (cur_ev->data).fd;
      fprintf(_stderr,"%s(%d)-<%s>: epollout fd %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
              ,0x65,"handle",(ulong)uVar1);
      fflush(_stderr);
      pCVar6 = this;
      pCVar5 = get_conn(this,uVar1);
      iVar3 = do_send(pCVar6,pCVar5);
      if (iVar3 == 0) {
        iVar3 = 1;
LAB_00102b19:
        Epoll::modify_event(&this->_epoll,uVar1,iVar3);
        return;
      }
      if (iVar3 == -4) {
LAB_00102a21:
        del_conn(this,uVar1);
        return;
      }
    }
  }
  else {
    uVar1 = (cur_ev->data).fd;
    if (uVar1 != this->_listen_fd) {
      fprintf(_stderr,"%s(%d)-<%s>: epollin sockfd %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
              ,0x29,"handle",(ulong)uVar1);
      fflush(_stderr);
      pCVar6 = this;
      pCVar5 = get_conn(this,uVar1);
      if (pCVar5 != (ConnInfo *)0x0) {
        iVar3 = do_recv(pCVar6,pCVar5);
        if (iVar3 == -1) {
          if ((pCVar5->buf)._r_pos == (pCVar5->buf)._w_pos) {
            uVar1 = pCVar5->fd;
            goto LAB_00102a21;
          }
        }
        else if (iVar3 != 0) {
          return;
        }
        iVar3 = 4;
        goto LAB_00102b19;
      }
      fprintf(_stderr,"%s(%d)-<%s>: Error: sockfd %d don\'t have conn info\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
              ,0x4b,"handle",(ulong)uVar1);
LAB_00102a62:
      fflush(_stderr);
      return;
    }
    client_sock_len = 0x10;
    uVar1 = accept(uVar1,(sockaddr *)&client_sock_addr,&client_sock_len);
    __stream = _stderr;
    if ((int)uVar1 < 0) {
      fprintf(_stderr,"%s(%d)-<%s>: accept sock failed!\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
              ,0x57,"handle");
      fflush(_stderr);
    }
    else {
      pcVar4 = inet_ntoa((in_addr)client_sock_addr.sin_addr.s_addr);
      fprintf(__stream,"%s(%d)-<%s>: accept fd %d, ip: %s port: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
              ,0x5a,"handle",(ulong)uVar1,pcVar4,
              (ulong)(ushort)(client_sock_addr.sin_port << 8 | client_sock_addr.sin_port >> 8));
      fflush(_stderr);
      add_conn(this,uVar1,&client_sock_addr);
      uVar2 = fcntl(uVar1,3,0);
      fcntl(uVar1,4,(ulong)(uVar2 | 0x800));
      Epoll::add_event(&this->_epoll,uVar1,1);
    }
  }
  return;
}

Assistant:

void Conn::handle(struct epoll_event &cur_ev)
{
    if (cur_ev.events & EPOLLIN)
    {
        int cur_fd = cur_ev.data.fd;
        if (cur_fd != _listen_fd)   //sockfd
        {
            LOG_PRINT("epollin sockfd %d", cur_fd);
            ConnInfo *conn_info = get_conn(cur_fd);
            if (conn_info != nullptr)
            {
                int ret = do_recv(conn_info);
                if (ret == err_svr_recv_normal)
                {
                    //修改sockfd描述符事件，增加写事件
                    _epoll.modify_event(cur_fd, EPOLLOUT);
                }
                else if (ret == err_svr_recv_eof)
                {
                    if ((conn_info->buf).data_size() == 0)
                    {
                        del_conn(conn_info->fd);
                    }
                    else
                    {
                        //修改sockfd描述符事件，增加写事件
                        _epoll.modify_event(cur_fd, EPOLLOUT);
                    }
                }
                else if (ret == err_svr_recv_nospace)
                {
                    // Buff& buf = conn_info->buf;
                    // if (buf.data_size() > 0)
                    // {
                    //     //修改sockfd描述符事件，增加写事件
                    //     _epoll.modify_event(cur_fd, EPOLLOUT);
                    // }
                }
            }
            else
            {
                LOG_PRINT("Error: sockfd %d don't have conn info", cur_fd);
                return ;
            }  
        }
        else    //listen_fd
        {
            struct sockaddr_in client_sock_addr;
            socklen_t client_sock_len;
            client_sock_len = sizeof(struct sockaddr_in);
            int fd = accept(_listen_fd, (struct sockaddr *)&client_sock_addr, &client_sock_len);
            if (fd < 0)
            {
                LOG_PRINT("accept sock failed!");
                return ;
            }
            LOG_PRINT("accept fd %d, ip: %s port: %d", fd, inet_ntoa(client_sock_addr.sin_addr), ntohs(client_sock_addr.sin_port));
            add_conn(fd, client_sock_addr);

            int flags = fcntl(fd, F_GETFL, 0);
            fcntl(fd, F_SETFL, flags | O_NONBLOCK);
            _epoll.add_event(fd, EPOLLIN);
        }
    }
    else if (cur_ev.events & EPOLLOUT)
    {
        int cur_fd = cur_ev.data.fd;
        LOG_PRINT("epollout fd %d", cur_fd);
        ConnInfo *conn_info = get_conn(cur_fd);
        int ret = do_send(conn_info);
        if (ret == err_svr_send_disconn)
        {
            del_conn(cur_fd);
        }
        else if (ret == err_svr_send_normal)
        {
            _epoll.modify_event(cur_fd, EPOLLIN);
        }
        
    }
    else if (cur_ev.events & EPOLLHUP)
    {
        LOG_PRINT("epollhup fd %d", cur_ev.data.fd);
    }
}